

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O1

SpeakerPosition * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock
          (SpeakerPosition *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          SpeakerPosition *position)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  storage_t *psVar4;
  type *ptVar5;
  bool bVar6;
  bool bVar7;
  undefined1 local_1b0 [128];
  dummy_u local_130;
  bool local_110;
  dummy_u local_108;
  CartesianSpeakerPosition local_e8;
  
  uVar1 = position->which_ >> 0x1f ^ position->which_;
  if (0x13 < uVar1) {
switchD_0015df81_caseD_2:
    boost::detail::variant::
    forced_return<boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>>();
  }
  switch(uVar1) {
  case 0:
    psVar4 = &position->storage_;
    ptVar5 = (type *)local_1b0;
    for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
      *ptVar5 = (psVar4->super_aligned_storage_imp<200UL,_8UL>).data_.align_;
      psVar4 = (storage_t *)((long)&(psVar4->super_aligned_storage_imp<200UL,_8UL>).data_ + 8);
      ptVar5 = ptVar5 + 1;
    }
    local_1b0[0x78] = false;
    bVar6 = (position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_.buf[0x78] == '\x01';
    if (bVar6) {
      local_130.aligner_ = (type)((long)local_1b0 + 0x90);
      lVar3 = *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_ +
                       0x80);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1b0 + 0x80),lVar3,
                 *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_ +
                          0x88) + lVar3);
    }
    local_110 = false;
    bVar7 = (position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_.buf[0xa0] == '\x01';
    local_1b0[0x78] = bVar6;
    if (bVar7) {
      local_108.aligner_ = (type)((long)local_1b0 + 0xb8);
      lVar3 = *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_ +
                       0xa8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1b0 + 0xa8),lVar3,
                 *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_ +
                          0xb0) + lVar3);
    }
    local_110 = bVar7;
    _applyScreenEdgeLock((PolarSpeakerPosition *)&local_e8,this,(PolarSpeakerPosition *)local_1b0);
    iVar2 = boost::detail::variant::make_initializer_node::
            apply<boost::mpl::pair<boost::detail::variant::initializer_root,_mpl_::int_<0>_>,_boost::mpl::l_iter<boost::mpl::list2<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>_>_>
            ::initializer_node::initialize(&__return_storage_ptr__->storage_,(param2_T)&local_e8);
    break;
  case 1:
    psVar4 = &position->storage_;
    ptVar5 = (type *)local_1b0;
    for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
      *ptVar5 = (psVar4->super_aligned_storage_imp<200UL,_8UL>).data_.align_;
      psVar4 = (storage_t *)((long)&(psVar4->super_aligned_storage_imp<200UL,_8UL>).data_ + 8);
      ptVar5 = ptVar5 + 1;
    }
    local_1b0[0x78] = false;
    bVar6 = (position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_.buf[0x78] == '\x01';
    if (bVar6) {
      local_130.aligner_ = (type)((long)local_1b0 + 0x90);
      lVar3 = *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_ +
                       0x80);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1b0 + 0x80),lVar3,
                 *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_ +
                          0x88) + lVar3);
    }
    local_110 = false;
    bVar7 = (position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_.buf[0xa0] == '\x01';
    local_1b0[0x78] = bVar6;
    if (bVar7) {
      local_108.aligner_ = (type)((long)local_1b0 + 0xb8);
      lVar3 = *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_ +
                       0xa8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1b0 + 0xa8),lVar3,
                 *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_ +
                          0xb0) + lVar3);
    }
    local_110 = bVar7;
    _applyScreenEdgeLock(&local_e8,this,(CartesianSpeakerPosition *)local_1b0);
    iVar2 = boost::detail::variant::make_initializer_node::
            apply<boost::mpl::pair<boost::detail::variant::make_initializer_node::apply<boost::mpl::pair<boost::detail::variant::initializer_root,_mpl_::int_<0>_>,_boost::mpl::l_iter<boost::mpl::list2<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>_>_>::initializer_node,_mpl_::int_<1>_>,_boost::mpl::l_iter<boost::mpl::list1<ear::CartesianSpeakerPosition>_>_>
            ::initializer_node::initialize(&__return_storage_ptr__->storage_,&local_e8);
    break;
  default:
    goto switchD_0015df81_caseD_2;
  }
  __return_storage_ptr__->which_ = iVar2;
  if (local_e8.screenEdgeLock.vertical.super_type.m_initialized == true) {
    if (local_e8.screenEdgeLock.vertical.super_type.m_storage.dummy_.aligner_ !=
        (type)((long)&local_e8.screenEdgeLock.vertical.super_type.m_storage.dummy_ + 0x10U)) {
      operator_delete((void *)local_e8.screenEdgeLock.vertical.super_type.m_storage.dummy_.aligner_,
                      local_e8.screenEdgeLock.vertical.super_type.m_storage.dummy_._16_8_ + 1);
    }
    local_e8.screenEdgeLock.vertical.super_type.m_initialized = false;
  }
  if (local_e8.screenEdgeLock.horizontal.super_type.m_initialized == true) {
    if (local_e8.screenEdgeLock.horizontal.super_type.m_storage.dummy_.aligner_ !=
        (type)((long)&local_e8.screenEdgeLock.horizontal.super_type.m_storage.dummy_ + 0x10U)) {
      operator_delete((void *)local_e8.screenEdgeLock.horizontal.super_type.m_storage.dummy_.
                              aligner_,
                      local_e8.screenEdgeLock.horizontal.super_type.m_storage.dummy_._16_8_ + 1);
    }
    local_e8.screenEdgeLock.horizontal.super_type.m_initialized = false;
  }
  if (local_110 == true) {
    if (local_108.aligner_ != (type)((long)local_1b0 + 0xb8)) {
      operator_delete((void *)local_108.aligner_,local_108._16_8_ + 1);
    }
    local_110 = false;
  }
  if ((local_1b0[0x78] == true) && (local_130.aligner_ != (type)((long)local_1b0 + 0x90))) {
    operator_delete((void *)local_130.aligner_,local_130._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

SpeakerPosition GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock(
      const SpeakerPosition& position) {
    return boost::apply_visitor(
        [this](const auto& p) {
          return SpeakerPosition(_applyScreenEdgeLock(p));
        },
        position);
  }